

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_OStream.cc
# Opt level: O2

void __thiscall Pl_OStream::Pl_OStream(Pl_OStream *this,char *identifier,ostream *os)

{
  Pipeline::Pipeline(&this->super_Pipeline,identifier,(Pipeline *)0x0);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_OStream_002ac600;
  std::make_unique<Pl_OStream::Members,std::ostream&>
            ((basic_ostream<char,_std::char_traits<char>_> *)&this->m);
  return;
}

Assistant:

Pl_OStream::Pl_OStream(char const* identifier, std::ostream& os) :
    Pipeline(identifier, nullptr),
    m(std::make_unique<Members>(os))
{
}